

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RestReader.cpp
# Opt level: O2

void __thiscall OpenMD::RestReader::readReferenceStructure(RestReader *this)

{
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *this_00;
  pointer pVVar1;
  long lVar2;
  Molecule *propName;
  MolecularRestraint *pMVar3;
  long lVar4;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar5;
  long lVar6;
  Vector<double,_3U> *this_01;
  StuntDouble *pSVar7;
  pointer ppSVar8;
  shared_ptr<OpenMD::GenericData> data;
  shared_ptr<OpenMD::SimpleTypeData<OpenMD::Restraint_*>_> restData;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> ref;
  MoleculeIterator i;
  Vector3d COM;
  undefined1 local_108 [16];
  shared_ptr<OpenMD::GenericData> local_f8;
  _Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> local_e8;
  RestReader *local_c8;
  MolecularRestraint *local_c0;
  pointer local_b8;
  MoleculeIterator local_b0;
  Vector<double,_3U> local_a8;
  _Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> local_90;
  Vector<double,_3U> local_78;
  Vector<double,_3U> local_60;
  allocator<char> local_48 [24];
  
  this_00 = &this->all_pos_;
  pVVar1 = (this->all_pos_).
           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->all_pos_).
      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl
      .super__Vector_impl_data._M_finish != pVVar1) {
    (this->all_pos_).
    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = pVVar1;
  }
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::resize
            (this_00,(long)this->info_->nGlobalIntegrableObjects_);
  scanFile(this);
  readSet(this);
  local_b0._M_node = (_Base_ptr)0x0;
  propName = SimInfo::beginMolecule(this->info_,&local_b0);
  local_c8 = this;
  do {
    if (propName == (Molecule *)0x0) {
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"Restraint",local_48);
    Molecule::getPropertyByName((Molecule *)local_108,(string *)propName);
    std::__cxx11::string::~string((string *)&local_e8);
    if ((_func_int **)local_108._0_8_ != (_func_int **)0x0) {
      std::dynamic_pointer_cast<OpenMD::SimpleTypeData<OpenMD::Restraint*>,OpenMD::GenericData>
                (&local_f8);
      if (local_f8.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        if (((Atom *)local_f8.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr[1]._vptr_GenericData != (Atom *)0x0) &&
           (pMVar3 = (MolecularRestraint *)
                     __dynamic_cast((Atom *)local_f8.
                                            super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr[1]._vptr_GenericData,&Restraint::typeinfo,
                                    &MolecularRestraint::typeinfo,0),
           pMVar3 != (MolecularRestraint *)0x0)) {
          local_e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_a8.data_[0] = 0.0;
          this_01 = &local_78;
          local_c0 = pMVar3;
          Vector<double,_3U>::Vector(this_01,local_a8.data_);
          Vector<double,_3U>::Vector((Vector<double,_3U> *)local_48,this_01);
          ppSVar8 = (propName->integrableObjects_).
                    super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar4 = 0;
          pSVar7 = (StuntDouble *)0x0;
          uVar5 = extraout_RDX;
          lVar2 = 0;
          if (ppSVar8 !=
              (propName->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) goto LAB_00196e28;
          do {
            lVar6 = lVar4 * 0x18;
            do {
              if (pSVar7 == (StuntDouble *)0x0) {
                Vector<double,_3U>::div((Vector<double,_3U> *)local_48,(int)this_01,(int)uVar5);
                std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
                vector((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *
                       )&local_90,
                       (vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *
                       )&local_e8);
                Vector<double,_3U>::Vector(&local_60,(Vector<double,_3U> *)local_48);
                this = local_c8;
                MolecularRestraint::setReferenceStructure
                          (local_c0,(vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                     *)&local_90,(Vector3d *)&local_60);
                std::
                _Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
                ~_Vector_base(&local_90);
                std::
                _Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
                ~_Vector_base(&local_e8);
                goto LAB_00196e9e;
              }
              std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
              push_back((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                         *)&local_e8,
                        (this_00->
                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                        )._M_impl.super__Vector_impl_data._M_start +
                        pSVar7->globalIntegrableObjectIndex_);
              local_b8 = (pointer)pSVar7->mass_;
              operator*(&local_a8,(double)local_b8,
                        (Vector<double,_3U> *)
                        ((long)((local_e8._M_impl.super__Vector_impl_data._M_start)->
                               super_Vector<double,_3U>).data_ + lVar6));
              operator+(&local_78,(Vector<double,_3U> *)local_48,&local_a8);
              this_01 = &local_78;
              Vector3<double>::operator=((Vector3<double> *)local_48,this_01);
              lVar4 = lVar4 + 1;
              ppSVar8 = ppSVar8 + 1;
              lVar6 = lVar6 + 0x18;
              pSVar7 = (StuntDouble *)0x0;
              uVar5 = extraout_RDX_00;
              lVar2 = lVar4;
            } while (ppSVar8 ==
                     (propName->integrableObjects_).
                     super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
LAB_00196e28:
            lVar4 = lVar2;
            pSVar7 = *ppSVar8;
          } while( true );
        }
        builtin_strncpy(painCave.errMsg,"Can not cast RestraintData to MolecularRestraint\n",0x32);
        painCave.isFatal = 1;
        painCave.severity = 1;
        simError();
      }
LAB_00196e9e:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_f8.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_108 + 8));
    propName = SimInfo::nextMolecule(this->info_,&local_b0);
  } while( true );
}

Assistant:

void RestReader::readReferenceStructure() {
    // We need temporary storage to keep track of all StuntDouble positions
    // in case some of the restraints are molecular (i.e. if they use
    // multiple SD positions to determine restrained orientations or positions:

    all_pos_.clear();
    all_pos_.resize(info_->getNGlobalIntegrableObjects());

    // Restraint files are just standard dump files, but with the reference
    // structure stored in the first frame (frame 0).
    // RestReader overloads readSet and explicitly handles all of the
    // ObjectRestraints in that method:

    scanFile();

    readSet();

    // all ObjectRestraints have been handled, now we have to worry about
    // molecular restraints:

    SimInfo::MoleculeIterator i;
    Molecule::IntegrableObjectIterator j;
    Molecule* mol;
    StuntDouble* sd;

    // no need to worry about parallel molecules, as molecules are not
    // split across processor boundaries.  Just loop over all molecules
    // we know about:

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      // is this molecule restrained?
      std::shared_ptr<GenericData> data = mol->getPropertyByName("Restraint");

      if (data != nullptr) {
        // make sure we can reinterpret the generic data as restraint data:

        std::shared_ptr<RestraintData> restData =
            std::dynamic_pointer_cast<RestraintData>(data);

        if (restData != nullptr) {
          // make sure we can reinterpet the restraint data as a
          // pointer to a MolecularRestraint:

          MolecularRestraint* mRest =
              dynamic_cast<MolecularRestraint*>(restData->getData());

          if (mRest == NULL) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "Can not cast RestraintData to MolecularRestraint\n");
            painCave.severity = OPENMD_ERROR;
            painCave.isFatal  = 1;
            simError();
          } else {
            // now we need to pack the stunt doubles for the reference
            // structure:

            std::vector<Vector3d> ref;
            int count = 0;
            RealType mass, mTot;
            Vector3d COM(0.0);

            mTot = 0.0;
            // loop over the stunt doubles in this molecule in the order we
            // will be looping them in the restraint code:

            for (sd = mol->beginIntegrableObject(j); sd != NULL;
                 sd = mol->nextIntegrableObject(j)) {
              // push back the reference positions of the stunt
              // doubles from the *globally* sorted array of
              // positions:

              ref.push_back(all_pos_[sd->getGlobalIntegrableObjectIndex()]);
              mass  = sd->getMass();
              COM   = COM + mass * ref[count];
              mTot  = mTot + mass;
              count = count + 1;
            }
            COM /= mTot;
            mRest->setReferenceStructure(ref, COM);
          }
        }
      }
    }
  }